

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<chaiscript::AST_Node_Trace_const&,void>
          (Boxed_Value *this,AST_Node_Trace *t,bool t_return_value)

{
  AST_Node_Trace AStack_78;
  
  AST_Node_Trace::AST_Node_Trace(&AStack_78,t);
  Object_Data::get<chaiscript::AST_Node_Trace>((AST_Node_Trace *)this,SUB81(&AStack_78,0));
  AST_Node_Trace::~AST_Node_Trace(&AStack_78);
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
        : m_data(Object_Data::get(std::forward<T>(t), t_return_value)) {
    }